

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O1

void read_cb(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  
  if (tcp != (uv_stream_t *)0x0) {
    if (nread < 0) {
      if (nread != -0xfff) goto LAB_001751ff;
      puts("GOT EOF");
      uv_close(tcp,close_cb);
    }
    else {
      bytes_received_done = bytes_received_done + nread;
    }
    free(buf->base);
    return;
  }
  read_cb_cold_2();
LAB_001751ff:
  read_cb_cold_1();
  if (tcp != (uv_stream_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(tcp,0);
  return;
}

Assistant:

static void read_cb(uv_stream_t* stream, ssize_t nread, const uv_buf_t* buf) {
  ASSERT((uv_tcp_t*)stream == &tcp_accepted);
  if (nread < 0) {
    uv_close((uv_handle_t*) stream, NULL);
  } else {
    read_size += nread;
    if (read_size == 16 && client_close == 0)
      do_close(&tcp_accepted);
  }
}